

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_FixUrl(uri_type *url,uri_type *fixed_url)

{
  int iVar1;
  int iVar2;
  
  memcpy(fixed_url,url,0xd0);
  iVar1 = token_string_casecmp(&fixed_url->scheme,"http");
  iVar2 = -0x6c;
  if (((iVar1 == 0) && ((fixed_url->hostport).text.size != 0)) &&
     (iVar2 = 0, (fixed_url->pathquery).size == 0)) {
    (fixed_url->pathquery).buff = "/";
    (fixed_url->pathquery).size = 1;
  }
  return iVar2;
}

Assistant:

int http_FixUrl(uri_type *url, uri_type *fixed_url)
{
	const char *temp_path = "/";

	*fixed_url = *url;
#ifdef UPNP_ENABLE_OPEN_SSL
	if (token_string_casecmp(&fixed_url->scheme, "http") != 0 &&
		token_string_casecmp(&fixed_url->scheme, "https") != 0) {
		return UPNP_E_INVALID_URL;
	}
#else
	if (token_string_casecmp(&fixed_url->scheme, "http") != 0) {
		return UPNP_E_INVALID_URL;
	}
#endif
	if (fixed_url->hostport.text.size == (size_t)0) {
		return UPNP_E_INVALID_URL;
	}
	/* set pathquery to "/" if it is empty */
	if (fixed_url->pathquery.size == (size_t)0) {
		fixed_url->pathquery.buff = temp_path;
		fixed_url->pathquery.size = (size_t)1;
	}

	return UPNP_E_SUCCESS;
}